

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O0

FlatTerm * Kernel::FlatTerm::create(TermList t)

{
  bool bVar1;
  FlatTerm *this;
  FlatTerm *res;
  Term *in_stack_000000d0;
  undefined8 in_stack_ffffffffffffffd8;
  uint num;
  FlatTerm *pFVar2;
  Entry *in_stack_ffffffffffffffe0;
  TermList local_10;
  FlatTerm *local_8;
  
  num = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = TermList::isTerm((TermList *)0x854013);
  if (bVar1) {
    TermList::term((TermList *)0x854023);
    local_8 = create(in_stack_000000d0);
  }
  else {
    this = (FlatTerm *)operator_new((size_t)in_stack_ffffffffffffffe0,num);
    FlatTerm(this,1);
    pFVar2 = this;
    TermList::var(&local_10);
    Entry::Entry(in_stack_ffffffffffffffe0,(EntryTag)((ulong)pFVar2 >> 0x20),(uint)pFVar2);
    this->_data[0]._content = (uint64_t)in_stack_ffffffffffffffe0;
    local_8 = this;
  }
  return local_8;
}

Assistant:

FlatTerm* FlatTerm::create(TermList t)
{
  if(t.isTerm()) {
    return create(t.term());
  }
  ASS(t.isOrdinaryVar());


  FlatTerm* res=new(1) FlatTerm(1);
  res->_data[0]=Entry(VAR, t.var());

  return res;
}